

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

void __thiscall FC_BPNN::~FC_BPNN(FC_BPNN *this)

{
  Preceptron *this_00;
  bool bVar1;
  size_type sVar2;
  reference this_01;
  reference ppVar3;
  pair<const_unsigned_long,_Preceptron_*> *element;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int i;
  FC_BPNN *this_local;
  
  __range2._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
            ::size(&this->net);
    if (sVar2 <= (ulong)(long)__range2._4_4_) break;
    this_01 = std::
              vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
              ::operator[](&this->net,(long)__range2._4_4_);
    __end2 = std::
             map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
             ::begin(this_01);
    element = (pair<const_unsigned_long,_Preceptron_*> *)
              std::
              map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
              ::end(this_01);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&element);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator*
                         (&__end2);
      this_00 = ppVar3->second;
      if (this_00 != (Preceptron *)0x0) {
        Preceptron::~Preceptron(this_00);
        operator_delete(this_00,0x98);
      }
      ppVar3->second = (Preceptron *)0x0;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Preceptron_*>_>::operator++(&__end2);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  std::
  vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ::~vector(&this->net);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_error);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_value);
  return;
}

Assistant:

FC_BPNN::~FC_BPNN()
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			delete element.second;
			element.second = nullptr;
		}
	}
}